

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

fdb_compact_decision
cb_upt(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
      uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_seqnum_t seqnum;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  fdb_kvs_handle *extraout_RDX;
  long extraout_RDX_00;
  uint uVar6;
  char *pcVar7;
  fdb_kvs_handle *pfVar8;
  uint uVar9;
  fdb_kvs_handle *pfVar10;
  ulong uVar11;
  fdb_doc *pfVar12;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar13;
  fdb_iterator *pfVar14;
  char *unaff_R12;
  fdb_kvs_handle *pfVar15;
  long lVar16;
  fdb_kvs_handle *unaff_R13;
  ulong uVar17;
  fdb_encryption_key *__s;
  fdb_kvs_handle *pfVar18;
  char *pcVar19;
  fdb_doc **ppfVar20;
  char *pcVar21;
  fdb_kvs_info *info;
  undefined4 uVar22;
  undefined4 uVar23;
  void *v_out;
  size_t vlen_out;
  timeval __test_begin;
  fdb_doc tdoc;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *pfStackY_1b80;
  timeval tStackY_1b78;
  fdb_config fStackY_1b68;
  code *pcStackY_1a70;
  fdb_snapshot_info_t *pfStackY_1a68;
  ulong uStackY_1a60;
  fdb_kvs_handle *pfStackY_1a58;
  fdb_kvs_handle *pfStackY_1a50;
  fdb_kvs_config fStackY_1a48;
  timeval tStackY_1a30;
  char *pcStackY_1a20;
  char *pcStackY_1a18;
  fdb_kvs_handle *pfStackY_1a10;
  char *pcStackY_1a08;
  char *pcStackY_1a00;
  code *pcStackY_19f8;
  fdb_file_handle *pfStackY_19e8;
  int iStackY_19dc;
  fdb_kvs_handle *pfStackY_19d8;
  fdb_kvs_handle *pfStackY_19d0;
  fdb_kvs_handle *pfStackY_19c8;
  fdb_kvs_handle *pfStackY_19c0;
  fdb_kvs_handle *pfStackY_19b8;
  undefined8 uStackY_19b0;
  undefined8 uStackY_19a8;
  undefined8 uStackY_19a0;
  timeval tStackY_1990;
  fdb_kvs_config fStackY_1980;
  fdb_config fStackY_1968;
  char acStackY_1870 [256];
  char acStackY_1770 [272];
  char *pcStackY_1660;
  fdb_kvs_handle *pfStackY_1658;
  char *pcStackY_1648;
  code *pcStackY_1640;
  fdb_snapshot_info_t *pfStackY_1630;
  fdb_kvs_handle *pfStackY_1628;
  uint64_t uStackY_1620;
  timeval tStackY_1618;
  size_t sStackY_1608;
  fdb_kvs_handle **ppfStackY_1600;
  code *pcStackY_15f8;
  fdb_kvs_handle *pfStackY_15f0;
  fdb_kvs_handle *pfStackY_15e8;
  fdb_kvs_handle *pfStackY_15e0;
  fdb_kvs_handle *pfStackY_15d8;
  undefined8 uStackY_15d0;
  undefined8 uStackY_15c8;
  fdb_kvs_handle *pfStackY_15c0;
  timeval tStackY_15b0;
  fdb_kvs_config fStackY_15a0;
  fdb_config fStackY_1588;
  char acStackY_1490 [256];
  fdb_kvs_handle *apfStackY_1390 [33];
  fdb_kvs_handle *pfStackY_1288;
  fdb_kvs_handle *pfStackY_1280;
  fdb_kvs_handle *pfStackY_1278;
  char *pcStackY_1270;
  fdb_kvs_handle *pfStackY_1268;
  fdb_kvs_handle *pfStackY_1260;
  fdb_iterator *pfStack_1248;
  uint uStack_123c;
  fdb_kvs_handle *pfStack_1238;
  fdb_file_handle *pfStack_1230;
  fdb_kvs_handle *pfStack_1228;
  char *pcStack_1220;
  int iStack_1218;
  undefined4 uStack_1214;
  fdb_snapshot_info_t *pfStack_1210;
  fdb_kvs_handle *pfStack_1208;
  fdb_kvs_handle *pfStack_1200;
  long lStack_11f8;
  fdb_kvs_config fStack_11f0;
  char acStack_11d8 [256];
  timeval tStack_10d8;
  undefined1 auStack_10c8 [312];
  size_t sStack_f90;
  undefined1 uStack_f80;
  undefined2 uStack_f78;
  undefined1 uStack_f58;
  list *plStack_ee0;
  fdb_seqnum_t *pfStack_ea0;
  fdb_kvs_handle *pfStack_e98;
  fdb_kvs_handle *pfStack_e90;
  fdb_doc **ppfStack_e88;
  fdb_kvs_info *pfStack_e80;
  fdb_kvs_handle *pfStack_e78;
  fdb_kvs_handle *pfStack_e68;
  fdb_kvs_handle *pfStack_e60;
  fdb_file_handle *pfStack_e58;
  fdb_doc *pfStack_e50;
  fdb_iterator *pfStack_e48;
  fdb_snapshot_info_t *pfStack_e40;
  uint64_t uStack_e38;
  fdb_kvs_info fStack_e30;
  timeval tStack_e00;
  fdb_kvs_config fStack_df0;
  fdb_config fStack_dd8;
  fdb_doc *apfStack_ce0 [32];
  char *pcStack_be0;
  fdb_kvs_handle *pfStack_bd8;
  fdb_kvs_handle *pfStack_bd0;
  char *pcStack_bc8;
  fdb_kvs_handle *pfStack_bc0;
  fdb_kvs_handle *pfStack_bb0;
  fdb_file_handle *pfStack_ba8;
  fdb_snapshot_info_t *pfStack_ba0;
  uint64_t uStack_b98;
  undefined1 auStack_b90 [16];
  timeval tStack_b80;
  fdb_kvs_config fStack_b70;
  fdb_kvs_info fStack_b58;
  undefined1 auStack_b28 [292];
  undefined4 uStack_a04;
  char *pcStack_930;
  fdb_kvs_handle *pfStack_928;
  fdb_kvs_handle *pfStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *pcStack_908;
  fdb_file_handle *pfStack_900;
  uint64_t uStack_8f8;
  fdb_snapshot_info_t *pfStack_8f0;
  fdb_kvs_handle *pfStack_8e8;
  timeval tStack_8e0;
  fdb_kvs_config fStack_8d0;
  fdb_config fStack_8b8;
  char acStack_7c0 [256];
  char *pcStack_6c0;
  fdb_kvs_handle *pfStack_6b8;
  fdb_kvs_handle *pfStack_6b0;
  fdb_kvs_handle *pfStack_6a8;
  code *pcStack_6a0;
  fdb_kvs_handle *pfStack_698;
  fdb_file_handle *pfStack_690;
  timeval tStack_688;
  char acStack_678 [256];
  fdb_doc *pfStack_578;
  fdb_kvs_handle *pfStack_570;
  fdb_kvs_handle *pfStack_568;
  fdb_doc **ppfStack_560;
  code *pcStack_558;
  fdb_kvs_handle *pfStack_548;
  fdb_kvs_handle *pfStack_540;
  fdb_doc *pfStack_538;
  char *pcStack_530;
  size_t sStack_528;
  fdb_kvs_handle *pfStack_520;
  timeval tStack_518;
  fdb_kvs_config fStack_508;
  undefined1 auStack_4f0 [360];
  undefined4 uStack_388;
  fdb_kvs_handle **ppfStack_380;
  fdb_kvs_handle *pfStack_2f0;
  fdb_kvs_handle *pfStack_2e8;
  fdb_encryption_key *pfStack_2e0;
  fdb_encryption_key *pfStack_2d8;
  fdb_kvs_handle *pfStack_2d0;
  fdb_encryption_key *local_2c0;
  fdb_kvs_handle *local_2b8;
  size_t local_2b0;
  void *local_2a8;
  size_t local_2a0;
  timeval local_298;
  fdb_doc local_288;
  fdb_kvs_handle local_238;
  
  pfVar10 = (fdb_kvs_handle *)(ulong)status;
  pfStack_2d0 = (fdb_kvs_handle *)0x11194a;
  gettimeofday(&local_298,(__timezone_ptr_t)0x0);
  if (status != 2) {
    return 0;
  }
  iVar2 = *(int *)((long)ctx + 0x24);
  *(int *)((long)ctx + 0x24) = iVar2 + 1;
  if ((iVar2 < 5) || (*(int *)((long)ctx + 0x20) != 0)) {
LAB_00111b01:
    pfVar15 = pfVar10;
    pcVar19 = (char *)ctx;
    if ((10 < *(int *)((long)ctx + 0x24)) && (*(int *)((long)ctx + 0x20) == 1)) {
      __s = &local_238.config.encryption_key;
      unaff_R12 = (char *)&local_238;
      pfVar15 = (fdb_kvs_handle *)0x0;
      local_2c0 = (fdb_encryption_key *)kv_name;
      do {
        pfStack_2d0 = (fdb_kvs_handle *)0x111b43;
        sprintf((char *)__s,"xxx%d",pfVar15);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b56;
        sprintf(unaff_R12,"xxxvalue%d",pfVar15);
        unaff_R13 = *(fdb_kvs_handle **)((long)ctx + 8);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b62;
        sVar3 = strlen((char *)__s);
        pcVar19 = (char *)(sVar3 + 1);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b6e;
        sVar3 = strlen(unaff_R12);
        pfStack_2d0 = (fdb_kvs_handle *)0x111b83;
        fVar1 = fdb_set_kv(unaff_R13,__s,(size_t)pcVar19,unaff_R12,sVar3 + 1);
        pfVar10 = (fdb_kvs_handle *)ctx;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111c7b;
        pfStack_2d0 = (fdb_kvs_handle *)0x111b95;
        fVar1 = fdb_commit(*ctx,'\0');
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111c76;
        uVar6 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar6;
      } while (uVar6 == 1);
      *(undefined4 *)((long)ctx + 0x20) = 2;
      kv_name = (char *)local_2c0;
    }
    __s = (fdb_encryption_key *)kv_name;
    if ((*(int *)((long)ctx + 0x24) == 0x11) && (*(int *)((long)ctx + 0x20) == 2)) {
      __s = &local_238.config.encryption_key;
      pcVar19 = "zzzvalue%d";
      unaff_R12 = (char *)&local_238;
      pfVar15 = (fdb_kvs_handle *)0x0;
      local_2c0 = (fdb_encryption_key *)kv_name;
      do {
        pfStack_2d0 = (fdb_kvs_handle *)0x111bf5;
        sprintf((char *)__s,"zzz%d",pfVar15);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c04;
        sprintf(unaff_R12,"zzzvalue%d",pfVar15);
        unaff_R13 = *(fdb_kvs_handle **)((long)ctx + 8);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c10;
        sVar3 = strlen((char *)__s);
        pfVar10 = (fdb_kvs_handle *)(sVar3 + 1);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c1c;
        sVar3 = strlen(unaff_R12);
        pfStack_2d0 = (fdb_kvs_handle *)0x111c31;
        fVar1 = fdb_set_kv(unaff_R13,__s,(size_t)pfVar10,unaff_R12,sVar3 + 1);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111c71;
        uVar6 = (int)pfVar15 + 1;
        pfVar15 = (fdb_kvs_handle *)(ulong)uVar6;
      } while (uVar6 == 1);
      *(undefined4 *)((long)ctx + 0x20) = 3;
      __s = local_2c0;
    }
    if ((short)__s->algorithm == 0x6264) {
      return 0;
    }
    goto LAB_00111c8a;
  }
  local_288.body = (void *)0x0;
  local_288.deleted = false;
  local_288._73_3_ = 0;
  local_288.flags = 0;
  local_288.offset = 0;
  local_288.meta = (void *)0x0;
  local_288.seqnum = 0;
  local_288.bodylen = 0;
  local_288.size_ondisk = 0;
  local_288.metalen = 0;
  local_288.key = doc->key;
  local_288.keylen = doc->keylen;
  pfStack_2d0 = (fdb_kvs_handle *)0x1119b1;
  local_2c0 = (fdb_encryption_key *)kv_name;
  fVar1 = fdb_get(*(fdb_kvs_handle **)((long)ctx + 8),&local_288);
  pfVar15 = pfVar10;
  __s = (fdb_encryption_key *)kv_name;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfStack_2d0 = (fdb_kvs_handle *)0x1119c6;
    free(local_288.meta);
    pfStack_2d0 = (fdb_kvs_handle *)0x1119d3;
    free(local_288.body);
    pfVar10 = (fdb_kvs_handle *)0x1;
    pcVar19 = (char *)&local_238.config.encryption_key;
    unaff_R12 = "new_body%04d";
    unaff_R13 = &local_238;
    __s = (fdb_encryption_key *)0x0;
    do {
      pfStack_2d0 = (fdb_kvs_handle *)0x111a06;
      sprintf(pcVar19,"new%04d",__s);
      pfStack_2d0 = (fdb_kvs_handle *)0x111a16;
      sprintf((char *)unaff_R13,"new_body%04d",__s);
      local_2b8 = *(fdb_kvs_handle **)((long)ctx + 8);
      pfStack_2d0 = (fdb_kvs_handle *)0x111a27;
      sVar3 = strlen(pcVar19);
      local_2b0 = sVar3 + 1;
      pfStack_2d0 = (fdb_kvs_handle *)0x111a37;
      sVar3 = strlen((char *)unaff_R13);
      pfStack_2d0 = (fdb_kvs_handle *)0x111a50;
      fVar1 = fdb_set_kv(local_2b8,pcVar19,local_2b0,unaff_R13,sVar3 + 1);
      pfVar15 = pfVar10;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111c85;
      pfStack_2d0 = (fdb_kvs_handle *)0x111a62;
      fVar1 = fdb_commit(*ctx,'\0');
      local_2b8 = (fdb_kvs_handle *)CONCAT44(local_2b8._4_4_,(int)pfVar10);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00111c80;
      do {
        pfStack_2d0 = (fdb_kvs_handle *)0x111a84;
        sprintf(pcVar19,"new%04d",__s);
        pfStack_2d0 = (fdb_kvs_handle *)0x111a94;
        sprintf((char *)unaff_R13,"new_body%04d",__s);
        pfVar15 = *(fdb_kvs_handle **)((long)ctx + 0x10);
        pfStack_2d0 = (fdb_kvs_handle *)0x111aa8;
        sVar3 = strlen(pcVar19);
        pfStack_2d0 = (fdb_kvs_handle *)0x111ac1;
        fVar1 = fdb_get_kv(pfVar15,pcVar19,sVar3 + 1,&local_2a8,&local_2a0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          pfStack_2d0 = (fdb_kvs_handle *)0x111c71;
          cb_upt();
          goto LAB_00111c71;
        }
        pfStack_2d0 = (fdb_kvs_handle *)0x111ad3;
        fdb_free_block(local_2a8);
        uVar6 = (int)pfVar10 - 1;
        pfVar10 = (fdb_kvs_handle *)(ulong)uVar6;
      } while (uVar6 != 0);
      uVar6 = (int)__s + 1;
      __s = (fdb_encryption_key *)(ulong)uVar6;
      pfVar10 = (fdb_kvs_handle *)(ulong)((int)local_2b8 + 1);
    } while (uVar6 != 5);
    *(undefined4 *)((long)ctx + 0x20) = 1;
    kv_name = (char *)local_2c0;
    goto LAB_00111b01;
  }
  goto LAB_00111c92;
LAB_00111ef9:
  pcStack_558 = (code *)0x111efe;
  compact_deleted_doc_test();
  goto LAB_00111efe;
LAB_001120ac:
  pcStack_6a0 = (code *)0x1120b1;
  compaction_del_cb();
  pfVar15 = pfVar18;
LAB_001120b1:
  pfVar10 = (fdb_kvs_handle *)acStack_678;
  pcStack_6a0 = (code *)0x1120b6;
  compaction_del_cb();
  goto LAB_001120b6;
LAB_00112636:
  pfStack_bc0 = (fdb_kvs_handle *)0x11263b;
  wal_delete_compact_upto_test();
LAB_0011263b:
  pfStack_bc0 = (fdb_kvs_handle *)0x112640;
  wal_delete_compact_upto_test();
  goto LAB_00112640;
LAB_001129a8:
  pfStack_e78 = (fdb_kvs_handle *)0x1129ad;
  compact_upto_post_snapshot_test();
LAB_001129ad:
  pfStack_e78 = (fdb_kvs_handle *)0x1129b2;
  compact_upto_post_snapshot_test();
LAB_001129b2:
  pfStack_e78 = (fdb_kvs_handle *)0x1129b7;
  compact_upto_post_snapshot_test();
  goto LAB_001129b7;
LAB_0011305f:
  pfStackY_1260 = (fdb_kvs_handle *)0x113064;
  compact_upto_overwrite_test();
LAB_00113064:
  pfStackY_1260 = (fdb_kvs_handle *)0x113069;
  compact_upto_overwrite_test();
LAB_00113069:
  pfVar10 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  pfStackY_1260 = (fdb_kvs_handle *)0x11306e;
  compact_upto_overwrite_test();
LAB_0011306e:
  pfStackY_1260 = (fdb_kvs_handle *)0x11307e;
  compact_upto_overwrite_test();
LAB_0011307e:
  pfStackY_1260 = (fdb_kvs_handle *)0x113089;
  compact_upto_overwrite_test();
LAB_00113089:
  pfStackY_1260 = (fdb_kvs_handle *)0x11308e;
  compact_upto_overwrite_test();
LAB_0011308e:
  pfStackY_1260 = (fdb_kvs_handle *)0x113093;
  compact_upto_overwrite_test();
LAB_00113093:
  pfStackY_1260 = (fdb_kvs_handle *)0x113098;
  compact_upto_overwrite_test();
LAB_00113098:
  pfStackY_1260 = (fdb_kvs_handle *)0x11309d;
  compact_upto_overwrite_test();
LAB_0011309d:
  pfStackY_1260 = (fdb_kvs_handle *)0x1130a2;
  compact_upto_overwrite_test();
LAB_001130a2:
  pfStackY_1260 = (fdb_kvs_handle *)0x1130a7;
  compact_upto_overwrite_test();
  goto LAB_001130a7;
LAB_00111c71:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c76;
  cb_upt();
LAB_00111c76:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c7b;
  cb_upt();
LAB_00111c7b:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c80;
  cb_upt();
LAB_00111c80:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c85;
  cb_upt();
  ctx = pfVar10;
LAB_00111c85:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c8a;
  cb_upt();
LAB_00111c8a:
  pfStack_2d0 = (fdb_kvs_handle *)0x111c92;
  cb_upt();
  doc = (fdb_doc *)ctx;
  ctx = pcVar19;
LAB_00111c92:
  pfStack_2d0 = (fdb_kvs_handle *)compact_deleted_doc_test;
  cb_upt();
  pcStack_558 = (code *)0x111cb2;
  pfStack_2f0 = (fdb_kvs_handle *)doc;
  pfStack_2e8 = (fdb_kvs_handle *)unaff_R12;
  pfStack_2e0 = __s;
  pfStack_2d8 = (fdb_encryption_key *)ctx;
  pfStack_2d0 = pfVar15;
  gettimeofday(&tStack_518,(__timezone_ptr_t)0x0);
  pcStack_558 = (code *)0x111cb7;
  memleak_start();
  pcStack_558 = (code *)0x111cc3;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_558 = (code *)0x111cd3;
  fdb_get_default_config();
  pcStack_558 = (code *)0x111ce0;
  fdb_get_default_kvs_config();
  auStack_4f0[0x148] = 0;
  auStack_4f0._300_4_ = 1;
  auStack_4f0._352_8_ = compaction_del_cb;
  ppfStack_380 = &pfStack_520;
  uStack_388 = 0x10;
  pcStack_558 = (code *)0x111d1d;
  fdb_open((fdb_file_handle **)&pfStack_548,"./compact_test1",(fdb_config *)(auStack_4f0 + 0x108));
  pcStack_558 = (code *)0x111d30;
  fdb_kvs_open_default((fdb_file_handle *)pfStack_548,&pfStack_540,&fStack_508);
  pfStack_520 = pfStack_540;
  ppfVar20 = (fdb_doc **)0x14df20;
  uVar11 = 0;
  do {
    pcStack_558 = (code *)0x111d5b;
    sprintf((char *)auStack_4f0,"key%d",uVar11);
    pfVar15 = pfStack_540;
    pcStack_558 = (code *)0x111d68;
    sVar3 = strlen((char *)auStack_4f0);
    pcStack_558 = (code *)0x111d7f;
    pfVar12 = (fdb_doc *)auStack_4f0;
    pfVar10 = pfVar15;
    fVar1 = fdb_set_kv(pfVar15,(fdb_doc *)auStack_4f0,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_558 = (code *)0x111ef9;
      compact_deleted_doc_test();
      goto LAB_00111ef9;
    }
    uVar6 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar6;
  } while (uVar6 != 10);
  pcStack_558 = (code *)0x111d9d;
  fdb_commit((fdb_file_handle *)pfStack_548,'\x01');
  pfVar12 = (fdb_doc *)0x14d131;
  pcStack_558 = (code *)0x111dae;
  pfVar10 = pfStack_548;
  fVar1 = fdb_compact((fdb_file_handle *)pfStack_548,"compact_test2");
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_558 = (code *)0x111dc7;
    sVar4 = wal_get_num_flushable(*(filemgr **)(*(long *)&pfStack_548->kvs_config + 0x48));
    if (sVar4 != 0) {
      pcStack_558 = (code *)0x111dd6;
      compact_deleted_doc_test();
    }
    ppfVar20 = &pfStack_538;
    uVar11 = 0;
    do {
      pcStack_558 = (code *)0x111df8;
      sprintf(auStack_4f0,"key%d",uVar11);
      pcStack_558 = (code *)0x111e00;
      sVar3 = strlen(auStack_4f0);
      pcStack_558 = (code *)0x111e1e;
      fdb_doc_create(ppfVar20,auStack_4f0,sVar3,(void *)0x0,0,(void *)0x0,0);
      pcStack_558 = (code *)0x111e2d;
      pfVar12 = pfStack_538;
      pfVar10 = pfStack_540;
      fVar1 = fdb_get_metaonly(pfStack_540,pfStack_538);
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00111ef9;
      pcStack_558 = (code *)0x111e40;
      fdb_doc_free(pfStack_538);
      uVar6 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar6;
    } while (uVar6 != 10);
    pcVar19 = auStack_4f0;
    pcStack_558 = (code *)0x111e62;
    sprintf(pcVar19,"key%d",10);
    pfVar18 = pfStack_540;
    pcStack_558 = (code *)0x111e6f;
    sVar3 = strlen(pcVar19);
    pcStack_558 = (code *)0x111e87;
    pfVar12 = (fdb_doc *)pcVar19;
    pfVar10 = pfVar18;
    fVar1 = fdb_get_kv(pfVar18,pcVar19,sVar3,&pcStack_530,&sStack_528);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_558 = (code *)0x111e95;
      fdb_free_block(pcStack_530);
      pcStack_558 = (code *)0x111e9f;
      fdb_kvs_close(pfStack_540);
      pcStack_558 = (code *)0x111ea9;
      fdb_close((fdb_file_handle *)pfStack_548);
      pcStack_558 = (code *)0x111eae;
      fdb_shutdown();
      pcStack_558 = (code *)0x111eb3;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (compact_deleted_doc_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_558 = (code *)0x111ee4;
      iVar2 = fprintf(_stderr,pcVar19,"compact deleted doc test");
      return iVar2;
    }
  }
  else {
LAB_00111efe:
    pfVar18 = (fdb_kvs_handle *)auStack_4f0;
    pcVar19 = "key%d";
    pcStack_558 = (code *)0x111f03;
    compact_deleted_doc_test();
  }
  pcStack_558 = compaction_del_cb;
  compact_deleted_doc_test();
  pfStack_570 = pfVar15;
  pcVar7 = (char *)((ulong)pfVar12 & 0xffffffff);
  pcStack_6a0 = (code *)0x111f33;
  pfStack_578 = (fdb_doc *)pcVar19;
  pfStack_568 = pfVar18;
  ppfStack_560 = ppfVar20;
  pcStack_558 = (code *)uVar11;
  gettimeofday(&tStack_688,(__timezone_ptr_t)0x0);
  pfStack_698 = *(fdb_kvs_handle **)&pfStack_548->kvs_config;
  pfVar15 = extraout_RDX;
  if ((int)pfVar12 == 0x10) {
    if (extraout_RDX != (fdb_kvs_handle *)0x0) goto LAB_001120d9;
    if (pfStack_698 == (fdb_kvs_handle *)0x0) {
      return 0;
    }
    pcStack_6a0 = (code *)0x111f6e;
    fVar1 = fdb_open(&pfStack_690,"./compact_test1",
                     (fdb_config *)(*(long *)&pfVar10->kvs_config + 0x70));
    pfVar18 = extraout_RDX;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120de;
    pcStack_6a0 = (code *)0x111f86;
    fdb_kvs_open_default(pfStack_690,&pfStack_698,&pfStack_698->kvs_config);
    pcVar7 = "key%d";
    uVar11 = 0;
    do {
      pcStack_6a0 = (code *)0x111fa3;
      sprintf(acStack_678,"key%d",uVar11);
      pfVar18 = pfStack_698;
      pcStack_6a0 = (code *)0x111faf;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x111fbd;
      fVar1 = fdb_del_kv(pfVar18,acStack_678,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStack_6a0 = (code *)0x1120ac;
        compaction_del_cb();
        goto LAB_001120ac;
      }
      uVar6 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar6;
    } while (uVar6 != 10);
    pcVar7 = "KEY%d";
    uVar11 = 0;
    do {
      pcStack_6a0 = (code *)0x111fe9;
      sprintf(acStack_678,"KEY%d",uVar11);
      pfVar15 = pfStack_698;
      pcStack_6a0 = (code *)0x111ff5;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x112008;
      fVar1 = fdb_set_kv(pfVar15,acStack_678,sVar3,(void *)0x0,0);
      pfVar18 = pfStack_698;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120b1;
      pcStack_6a0 = (code *)0x11201c;
      sVar3 = strlen(acStack_678);
      pcStack_6a0 = (code *)0x11202a;
      fVar1 = fdb_del_kv(pfVar18,acStack_678,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120ac;
      uVar6 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar6;
    } while (uVar6 != 10);
    pcVar7 = acStack_678;
    pcStack_6a0 = (code *)0x112050;
    sprintf(pcVar7,"key%d",10);
    pfVar10 = pfStack_698;
    pcStack_6a0 = (code *)0x11205c;
    sVar3 = strlen(pcVar7);
    pcStack_6a0 = (code *)0x11206f;
    fVar1 = fdb_set_kv(pfVar10,pcVar7,sVar3,(void *)0x0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001120e3;
    pcStack_6a0 = (code *)0x11207f;
    fVar1 = fdb_commit(pfStack_690,'\0');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_6a0 = (code *)0x11208d;
      fdb_close(pfStack_690);
      *(undefined8 *)&pfStack_548->kvs_config = 0;
      return 0;
    }
  }
  else {
LAB_001120b6:
    iVar2 = (int)pcVar7;
    if (iVar2 == 8) {
LAB_001120cf:
      pcStack_6a0 = (code *)0x1120d4;
      compaction_del_cb();
    }
    else {
      if (iVar2 == 2) {
LAB_001120ca:
        pcStack_6a0 = (code *)0x1120cf;
        compaction_del_cb();
        goto LAB_001120cf;
      }
      if (iVar2 == 1) {
        pcStack_6a0 = (code *)0x1120ca;
        compaction_del_cb();
        goto LAB_001120ca;
      }
    }
    pcStack_6a0 = (code *)0x1120d9;
    compaction_del_cb();
LAB_001120d9:
    pcStack_6a0 = (code *)0x1120de;
    compaction_del_cb();
    pfVar18 = pfVar15;
LAB_001120de:
    pcStack_6a0 = (code *)0x1120e3;
    compaction_del_cb();
LAB_001120e3:
    pcStack_6a0 = (code *)0x1120e8;
    compaction_del_cb();
  }
  pcStack_6a0 = compact_upto_twice_test;
  compaction_del_cb();
  pfStack_6b8 = pfStack_548;
  pcStack_908 = (code *)0x112108;
  pcStack_6c0 = pcVar7;
  pfStack_6b0 = pfVar10;
  pfStack_6a8 = pfVar18;
  pcStack_6a0 = (code *)uVar11;
  gettimeofday(&tStack_8e0,(__timezone_ptr_t)0x0);
  pcStack_908 = (code *)0x11210d;
  memleak_start();
  pcStack_908 = (code *)0x112119;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_908 = (code *)0x112126;
  fdb_get_default_config();
  pcStack_908 = (code *)0x112133;
  fdb_get_default_kvs_config();
  fStack_8b8.wal_threshold = 0x400;
  fStack_8b8.flags = 1;
  fStack_8b8.block_reusing_threshold = 0;
  pcStack_908 = (code *)0x112162;
  fdb_open(&pfStack_900,"./compact_test1",&fStack_8b8);
  pcStack_908 = (code *)0x112172;
  fdb_kvs_open_default(pfStack_900,&pfStack_8e8,&fStack_8d0);
  uVar11 = 0;
  do {
    pcStack_908 = (code *)0x112199;
    sprintf(acStack_7c0,"key%d",uVar11);
    pfVar10 = pfStack_8e8;
    pcStack_908 = (code *)0x1121a6;
    sVar3 = strlen(acStack_7c0);
    pcStack_908 = (code *)0x1121bd;
    fVar1 = fdb_set_kv(pfVar10,acStack_7c0,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_908 = (code *)0x1122df;
      compact_upto_twice_test();
      goto LAB_001122df;
    }
    pcStack_908 = (code *)0x1121d3;
    fdb_commit(pfStack_900,'\x01');
    uVar6 = (int)uVar11 + 1;
    uVar11 = (ulong)uVar6;
  } while (uVar6 != 10);
  pcStack_908 = (code *)0x1121ed;
  fVar1 = fdb_get_all_snap_markers(pfStack_900,&pfStack_8f0,&uStack_8f8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_908 = (code *)0x112213;
    fVar1 = fdb_compact_upto(pfStack_900,(char *)0x0,pfStack_8f0[uStack_8f8 - 1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122e4;
    pcStack_908 = (code *)0x11222a;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8f8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122e9;
    pcStack_908 = (code *)0x112245;
    fVar1 = fdb_get_all_snap_markers(pfStack_900,&pfStack_8f0,&uStack_8f8);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122ee;
    pcStack_908 = (code *)0x11226b;
    fVar1 = fdb_compact_upto(pfStack_900,(char *)0x0,pfStack_8f0[uStack_8f8 - 2].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001122f3;
    pcStack_908 = (code *)0x112282;
    fVar1 = fdb_free_snap_markers(pfStack_8f0,uStack_8f8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStack_908 = (code *)0x11228f;
      fdb_close(pfStack_900);
      pcStack_908 = (code *)0x112294;
      fdb_shutdown();
      pcStack_908 = (code *)0x112299;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (compact_upto_twice_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_908 = (code *)0x1122ca;
      iVar2 = fprintf(_stderr,pcVar19,"compact upto twice");
      return iVar2;
    }
  }
  else {
LAB_001122df:
    pcStack_908 = (code *)0x1122e4;
    compact_upto_twice_test();
LAB_001122e4:
    pcStack_908 = (code *)0x1122e9;
    compact_upto_twice_test();
LAB_001122e9:
    pcStack_908 = (code *)0x1122ee;
    compact_upto_twice_test();
LAB_001122ee:
    pcStack_908 = (code *)0x1122f3;
    compact_upto_twice_test();
LAB_001122f3:
    pcStack_908 = (code *)0x1122f8;
    compact_upto_twice_test();
  }
  pcStack_908 = wal_delete_compact_upto_test;
  compact_upto_twice_test();
  pcStack_910 = "value";
  pfStack_928 = pfVar10;
  pcStack_930 = "key%d";
  pfStack_bc0 = (fdb_kvs_handle *)0x11231a;
  pfStack_920 = unaff_R13;
  pcStack_918 = acStack_7c0;
  pcStack_908 = (code *)uVar11;
  gettimeofday(&tStack_b80,(__timezone_ptr_t)0x0);
  pfStack_bc0 = (fdb_kvs_handle *)0x11231f;
  memleak_start();
  pfStack_bc0 = (fdb_kvs_handle *)0x11232b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_bc0 = (fdb_kvs_handle *)0x11233b;
  fdb_get_default_config();
  pfStack_bc0 = (fdb_kvs_handle *)0x112348;
  fdb_get_default_kvs_config();
  auStack_b28._272_8_ = (void *)0x13;
  uStack_a04 = 1;
  pfStack_bc0 = (fdb_kvs_handle *)0x11236e;
  fdb_open(&pfStack_ba8,"./compact_test5",(fdb_config *)(auStack_b28 + 0x100));
  pfStack_bc0 = (fdb_kvs_handle *)0x11237e;
  fdb_kvs_open_default(pfStack_ba8,&pfStack_bb0,&fStack_b70);
  pcVar7 = "key%d";
  pcVar19 = auStack_b28;
  pcVar21 = "value";
  pfVar10 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_bc0 = (fdb_kvs_handle *)0x1123a5;
    sprintf(pcVar19,"key%d",pfVar10);
    pfVar15 = pfStack_bb0;
    pfStack_bc0 = (fdb_kvs_handle *)0x1123b2;
    sVar3 = strlen(pcVar19);
    pfStack_bc0 = (fdb_kvs_handle *)0x1123c9;
    fVar1 = fdb_set_kv(pfVar15,pcVar19,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_bc0 = (fdb_kvs_handle *)0x112636;
      wal_delete_compact_upto_test();
      goto LAB_00112636;
    }
    uVar6 = (int)pfVar10 + 1;
    pfVar10 = (fdb_kvs_handle *)(ulong)uVar6;
  } while (uVar6 != 10);
  pfStack_bc0 = (fdb_kvs_handle *)0x1123e7;
  fVar1 = fdb_commit(pfStack_ba8,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar7 = (char *)0xa;
    pcVar19 = "key%d";
    pcVar21 = auStack_b28;
    pfVar15 = (fdb_kvs_handle *)0x14df20;
    do {
      pfStack_bc0 = (fdb_kvs_handle *)0x112419;
      sprintf(pcVar21,"key%d",pcVar7);
      unaff_R13 = pfStack_bb0;
      pfStack_bc0 = (fdb_kvs_handle *)0x112426;
      sVar3 = strlen(pcVar21);
      pfStack_bc0 = (fdb_kvs_handle *)0x11243d;
      fVar1 = fdb_set_kv(unaff_R13,pcVar21,sVar3,"value",5);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112636;
      uVar6 = (int)pcVar7 + 1;
      pcVar7 = (char *)(ulong)uVar6;
    } while (uVar6 != 0x14);
    pcVar7 = (char *)0xf;
    pcVar19 = "key%d";
    pcVar21 = auStack_b28;
    do {
      pfStack_bc0 = (fdb_kvs_handle *)0x11246f;
      sprintf(pcVar21,"key%d",pcVar7);
      pfVar15 = pfStack_bb0;
      pfStack_bc0 = (fdb_kvs_handle *)0x11247c;
      sVar3 = strlen(pcVar21);
      pfStack_bc0 = (fdb_kvs_handle *)0x11248a;
      fVar1 = fdb_del_kv(pfVar15,pcVar21,sVar3);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011263b;
      uVar6 = (int)pcVar7 + 1;
      pcVar7 = (char *)(ulong)uVar6;
    } while (uVar6 != 0x14);
    pfStack_bc0 = (fdb_kvs_handle *)0x1124a5;
    fVar1 = fdb_commit(pfStack_ba8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264a;
    pcVar7 = auStack_b28;
    pfStack_bc0 = (fdb_kvs_handle *)0x1124cb;
    sprintf(pcVar7,"key%d",0x14);
    pcVar19 = (char *)pfStack_bb0;
    pfStack_bc0 = (fdb_kvs_handle *)0x1124d8;
    sVar3 = strlen(pcVar7);
    pfStack_bc0 = (fdb_kvs_handle *)0x1124f3;
    fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar19,pcVar7,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264f;
    pfStack_bc0 = (fdb_kvs_handle *)0x112507;
    fVar1 = fdb_commit(pfStack_ba8,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112654;
    pfStack_bc0 = (fdb_kvs_handle *)0x112523;
    fVar1 = fdb_get_all_snap_markers(pfStack_ba8,&pfStack_ba0,&uStack_b98);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112659;
    pfStack_bc0 = (fdb_kvs_handle *)0x112540;
    fVar1 = fdb_compact_upto(pfStack_ba8,(char *)0x0,pfStack_ba0[1].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011265e;
    pfStack_bc0 = (fdb_kvs_handle *)0x112557;
    fVar1 = fdb_free_snap_markers(pfStack_ba0,uStack_b98);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112663;
    pfStack_bc0 = (fdb_kvs_handle *)0x11256e;
    fVar1 = fdb_get_kvs_info(pfStack_bb0,&fStack_b58);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar7 = (char *)0xf;
      pcVar19 = "key%d";
      pcVar21 = auStack_b28;
      pfVar15 = (fdb_kvs_handle *)(auStack_b90 + 8);
      unaff_R13 = (fdb_kvs_handle *)auStack_b90;
      while( true ) {
        pfStack_bc0 = (fdb_kvs_handle *)0x1125a3;
        sprintf(pcVar21,"key%d",pcVar7);
        pfVar10 = pfStack_bb0;
        pfStack_bc0 = (fdb_kvs_handle *)0x1125b0;
        sVar3 = strlen(pcVar21);
        pfStack_bc0 = (fdb_kvs_handle *)0x1125c4;
        fVar1 = fdb_get_kv(pfVar10,pcVar21,sVar3,(void **)pfVar15,(size_t *)unaff_R13);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
        uVar6 = (int)pcVar7 + 1;
        pcVar7 = (char *)(ulong)uVar6;
        if (uVar6 == 0x14) {
          pfStack_bc0 = (fdb_kvs_handle *)0x1125da;
          fdb_kvs_close(pfStack_bb0);
          pfStack_bc0 = (fdb_kvs_handle *)0x1125e4;
          fdb_close(pfStack_ba8);
          pfStack_bc0 = (fdb_kvs_handle *)0x1125e9;
          fdb_shutdown();
          pfStack_bc0 = (fdb_kvs_handle *)0x1125ee;
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (wal_delete_compact_upto_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          pfStack_bc0 = (fdb_kvs_handle *)0x11261f;
          iVar2 = fprintf(_stderr,pcVar19,"compact upto with wal deletes test");
          return iVar2;
        }
      }
LAB_00112640:
      pfStack_bc0 = (fdb_kvs_handle *)0x112645;
      wal_delete_compact_upto_test();
      goto LAB_00112645;
    }
  }
  else {
LAB_00112645:
    pfStack_bc0 = (fdb_kvs_handle *)0x11264a;
    wal_delete_compact_upto_test();
LAB_0011264a:
    pfStack_bc0 = (fdb_kvs_handle *)0x11264f;
    wal_delete_compact_upto_test();
LAB_0011264f:
    pfStack_bc0 = (fdb_kvs_handle *)0x112654;
    wal_delete_compact_upto_test();
LAB_00112654:
    pfStack_bc0 = (fdb_kvs_handle *)0x112659;
    wal_delete_compact_upto_test();
LAB_00112659:
    pfStack_bc0 = (fdb_kvs_handle *)0x11265e;
    wal_delete_compact_upto_test();
LAB_0011265e:
    pfStack_bc0 = (fdb_kvs_handle *)0x112663;
    wal_delete_compact_upto_test();
LAB_00112663:
    pfStack_bc0 = (fdb_kvs_handle *)0x112668;
    wal_delete_compact_upto_test();
  }
  pfStack_bc0 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pfStack_e78 = (fdb_kvs_handle *)0x11268b;
  pcStack_be0 = pcVar7;
  pfStack_bd8 = pfVar15;
  pfStack_bd0 = (fdb_kvs_handle *)pcVar19;
  pcStack_bc8 = pcVar21;
  pfStack_bc0 = pfVar10;
  gettimeofday(&tStack_e00,(__timezone_ptr_t)0x0);
  pfStack_e78 = (fdb_kvs_handle *)0x112690;
  memleak_start();
  pfStack_e50 = (fdb_doc *)0x0;
  pfStack_e78 = (fdb_kvs_handle *)0x1126a1;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_e78 = (fdb_kvs_handle *)0x1126b1;
  fdb_get_default_config();
  pfStack_e78 = (fdb_kvs_handle *)0x1126c1;
  fdb_get_default_kvs_config();
  fStack_dd8.wal_threshold = 0x400;
  fStack_dd8.flags = 1;
  fStack_dd8.block_reusing_threshold = 0;
  pfStack_e78 = (fdb_kvs_handle *)0x1126ee;
  fdb_open(&pfStack_e58,"./compact_test1",&fStack_dd8);
  pfStack_e78 = (fdb_kvs_handle *)0x1126fe;
  fdb_kvs_open_default(pfStack_e58,&pfStack_e60,&fStack_df0);
  pcVar19 = "key%d";
  ppfVar20 = apfStack_ce0;
  info = (fdb_kvs_info *)0x14df20;
  pcVar7 = (char *)0x0;
  do {
    pfStack_e78 = (fdb_kvs_handle *)0x112725;
    sprintf((char *)ppfVar20,"key%d",pcVar7);
    pfVar10 = pfStack_e60;
    pfStack_e78 = (fdb_kvs_handle *)0x112732;
    sVar3 = strlen((char *)ppfVar20);
    pfStack_e78 = (fdb_kvs_handle *)0x112749;
    pfVar15 = pfVar10;
    fVar1 = fdb_set_kv(pfVar10,ppfVar20,sVar3,"value",5);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_e78 = (fdb_kvs_handle *)0x1129a8;
      compact_upto_post_snapshot_test();
      goto LAB_001129a8;
    }
    pfStack_e78 = (fdb_kvs_handle *)0x112760;
    fdb_commit(pfStack_e58,'\x01');
    uVar6 = (int)pcVar7 + 1;
    pcVar7 = (char *)(ulong)uVar6;
  } while (uVar6 != 10);
  pfStack_e78 = (fdb_kvs_handle *)0x112776;
  pfVar15 = pfStack_e60;
  fVar1 = fdb_get_kvs_info(pfStack_e60,&fStack_e30);
  uVar6 = (uint)pfVar15;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar19 = (char *)&fStack_e30.last_seqnum;
    if (fStack_e30.last_seqnum != 10) {
      pfStack_e78 = (fdb_kvs_handle *)0x112791;
      compact_upto_post_snapshot_test();
    }
    pfStack_e78 = (fdb_kvs_handle *)0x1127a5;
    pfVar15 = pfStack_e60;
    fVar1 = fdb_snapshot_open(pfStack_e60,&pfStack_e68,5);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129bc;
    pfStack_e78 = (fdb_kvs_handle *)0x1127bc;
    pfVar15 = pfStack_e68;
    fVar1 = fdb_get_kvs_info(pfStack_e68,&fStack_e30);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c1;
    if (fStack_e30.last_seqnum != 5) {
      pfStack_e78 = (fdb_kvs_handle *)0x1127d4;
      compact_upto_post_snapshot_test();
    }
    pfStack_e78 = (fdb_kvs_handle *)0x1127e8;
    pfVar13 = pfStack_e58;
    fVar1 = fdb_get_all_snap_markers(pfStack_e58,&pfStack_e40,&uStack_e38);
    uVar6 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c6;
    pfStack_e78 = (fdb_kvs_handle *)0x112805;
    pfVar13 = pfStack_e58;
    fVar1 = fdb_compact_upto(pfStack_e58,(char *)0x0,pfStack_e40[5].marker);
    uVar6 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129cb;
    pfStack_e78 = (fdb_kvs_handle *)0x11281c;
    fVar1 = fdb_free_snap_markers(pfStack_e40,uStack_e38);
    uVar6 = (uint)pfStack_e40;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d0;
    pfStack_e78 = (fdb_kvs_handle *)0x112833;
    pfVar15 = pfStack_e60;
    fVar1 = fdb_get_kvs_info(pfStack_e60,&fStack_e30);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d5;
    if (fStack_e30.last_seqnum != 10) {
      pfStack_e78 = (fdb_kvs_handle *)0x11284b;
      compact_upto_post_snapshot_test();
    }
    pfStack_e78 = (fdb_kvs_handle *)0x11285a;
    pfVar15 = pfStack_e68;
    fVar1 = fdb_get_kvs_info(pfStack_e68,&fStack_e30);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129da;
    if (fStack_e30.last_seqnum != 5) {
      pfStack_e78 = (fdb_kvs_handle *)0x112872;
      compact_upto_post_snapshot_test();
    }
    pfStack_e78 = (fdb_kvs_handle *)0x112892;
    pfVar15 = pfStack_e68;
    fVar1 = fdb_iterator_init(pfStack_e68,&pfStack_e48,(void *)0x0,0,(void *)0x0,0,0);
    uVar6 = (uint)pfVar15;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129df;
    pcVar7 = (char *)0x5;
    ppfVar20 = &pfStack_e50;
    info = &fStack_e30;
    do {
      pfStack_e78 = (fdb_kvs_handle *)0x1128b6;
      pfVar14 = pfStack_e48;
      fVar1 = fdb_iterator_get(pfStack_e48,ppfVar20);
      uVar6 = (uint)pfVar14;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129a8;
      pfStack_e78 = (fdb_kvs_handle *)0x1128c8;
      fdb_doc_free(pfStack_e50);
      pfStack_e50 = (fdb_doc *)0x0;
      pfStack_e78 = (fdb_kvs_handle *)0x1128de;
      pfVar15 = pfStack_e60;
      fVar1 = fdb_get_kvs_info(pfStack_e60,info);
      uVar6 = (uint)pfVar15;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129ad;
      if (fStack_e30.last_seqnum != 10) {
        pfStack_e78 = (fdb_kvs_handle *)0x112926;
        compact_upto_post_snapshot_test();
      }
      pfStack_e78 = (fdb_kvs_handle *)0x1128fb;
      pfVar15 = pfStack_e68;
      fVar1 = fdb_get_kvs_info(pfStack_e68,info);
      uVar6 = (uint)pfVar15;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129b2;
      if (fStack_e30.last_seqnum != 5) {
        pfStack_e78 = (fdb_kvs_handle *)0x112930;
        compact_upto_post_snapshot_test();
      }
      pfStack_e78 = (fdb_kvs_handle *)0x112915;
      pfVar14 = pfStack_e48;
      fVar1 = fdb_iterator_next(pfStack_e48);
      uVar6 = (uint)pfVar14;
      uVar9 = (int)pcVar7 - 1;
      pcVar7 = (char *)(ulong)uVar9;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar9 == 0) {
      pfStack_e78 = (fdb_kvs_handle *)0x112944;
      fdb_iterator_close(pfStack_e48);
      pfStack_e78 = (fdb_kvs_handle *)0x11294e;
      fdb_kvs_close(pfStack_e68);
      pfStack_e78 = (fdb_kvs_handle *)0x112958;
      fdb_close(pfStack_e58);
      pfStack_e78 = (fdb_kvs_handle *)0x11295d;
      fdb_shutdown();
      pfStack_e78 = (fdb_kvs_handle *)0x112962;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pfStack_e78 = (fdb_kvs_handle *)0x112993;
      iVar2 = fprintf(_stderr,pcVar19,"compact upto post snapshot test");
      return iVar2;
    }
  }
  else {
LAB_001129b7:
    pfStack_e78 = (fdb_kvs_handle *)0x1129bc;
    compact_upto_post_snapshot_test();
LAB_001129bc:
    pfStack_e78 = (fdb_kvs_handle *)0x1129c1;
    compact_upto_post_snapshot_test();
LAB_001129c1:
    pfStack_e78 = (fdb_kvs_handle *)0x1129c6;
    compact_upto_post_snapshot_test();
LAB_001129c6:
    pfStack_e78 = (fdb_kvs_handle *)0x1129cb;
    compact_upto_post_snapshot_test();
LAB_001129cb:
    pfStack_e78 = (fdb_kvs_handle *)0x1129d0;
    compact_upto_post_snapshot_test();
LAB_001129d0:
    pfStack_e78 = (fdb_kvs_handle *)0x1129d5;
    compact_upto_post_snapshot_test();
LAB_001129d5:
    pfStack_e78 = (fdb_kvs_handle *)0x1129da;
    compact_upto_post_snapshot_test();
LAB_001129da:
    pfStack_e78 = (fdb_kvs_handle *)0x1129df;
    compact_upto_post_snapshot_test();
LAB_001129df:
    pfStack_e78 = (fdb_kvs_handle *)0x1129e4;
    compact_upto_post_snapshot_test();
  }
  pfStack_e78 = (fdb_kvs_handle *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  pfStack_e98 = pfVar10;
  pfVar18 = (fdb_kvs_handle *)0x0;
  pfStackY_1260 = (fdb_kvs_handle *)0x112a10;
  uStack_123c = uVar6;
  pfStack_ea0 = (fdb_seqnum_t *)pcVar19;
  pfStack_e90 = unaff_R13;
  ppfStack_e88 = ppfVar20;
  pfStack_e80 = info;
  pfStack_e78 = (fdb_kvs_handle *)pcVar7;
  gettimeofday(&tStack_10d8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_11d8,"rm -rf  compact_test* > errorlog.txt",0x25);
  pfStackY_1260 = (fdb_kvs_handle *)0x112a40;
  system(acStack_11d8);
  pfStackY_1260 = (fdb_kvs_handle *)0x112a45;
  memleak_start();
  pfStackY_1260 = (fdb_kvs_handle *)0x112a4f;
  pcVar19 = (char *)malloc(0x20);
  pfVar15 = (fdb_kvs_handle *)(auStack_10c8 + 0x130);
  pfStackY_1260 = (fdb_kvs_handle *)0x112a62;
  fdb_get_default_config();
  uStack_f78 = 0x201;
  uStack_f80 = 1;
  uStack_f58 = 1;
  sStack_f90 = 0;
  plStack_ee0 = (list *)0x0;
  pfStackY_1260 = (fdb_kvs_handle *)0x112a85;
  fdb_get_default_kvs_config();
  pfStackY_1260 = (fdb_kvs_handle *)0x112a99;
  fVar1 = fdb_open(&pfStack_1230,"./compact_test",(fdb_config *)pfVar15);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001130a7:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130ac;
    compact_upto_overwrite_test();
LAB_001130ac:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130b1;
    compact_upto_overwrite_test();
LAB_001130b1:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130b6;
    compact_upto_overwrite_test();
LAB_001130b6:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130bb;
    compact_upto_overwrite_test();
LAB_001130bb:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130c0;
    compact_upto_overwrite_test();
LAB_001130c0:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130c5;
    compact_upto_overwrite_test();
LAB_001130c5:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130ca;
    compact_upto_overwrite_test();
LAB_001130ca:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130cf;
    compact_upto_overwrite_test();
LAB_001130cf:
    pfStackY_1260 = (fdb_kvs_handle *)0x1130d4;
    compact_upto_overwrite_test();
LAB_001130d4:
    pfStackY_1260 = (fdb_kvs_handle *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_15f8 = (code *)0x1130f6;
    pfStackY_1288 = pfVar15;
    pfStackY_1280 = pfVar10;
    pfStackY_1278 = unaff_R13;
    pcStackY_1270 = pcVar19;
    pfStackY_1268 = pfVar18;
    pfStackY_1260 = (fdb_kvs_handle *)pcVar7;
    gettimeofday(&tStackY_15b0,(__timezone_ptr_t)0x0);
    pcStackY_15f8 = (code *)0x1130fb;
    memleak_start();
    pcStackY_15f8 = (code *)0x113108;
    fdb_get_default_config();
    pcStackY_15f8 = (code *)0x113115;
    fdb_get_default_kvs_config();
    fStackY_1588.compaction_cb_ctx = &uStackY_15d0;
    uStackY_15d0 = 0;
    uStackY_15c8 = 0;
    pfStackY_15c0 = (fdb_kvs_handle *)0x0;
    fStackY_1588.wal_threshold = 0x400;
    fStackY_1588.flags = 1;
    fStackY_1588.compaction_cb = compaction_cb_get;
    fStackY_1588.compaction_cb_mask = 0x1b;
    pcStackY_15f8 = (code *)0x11315b;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_15f8 = (code *)0x113170;
    fdb_open((fdb_file_handle **)&pfStackY_15f0,"./compact_test1",&fStackY_1588);
    pcStackY_15f8 = (code *)0x11318a;
    fdb_kvs_open((fdb_file_handle *)pfStackY_15f0,&pfStackY_15d8,"db",&fStackY_15a0);
    pcStackY_15f8 = (code *)0x11319d;
    fdb_kvs_open((fdb_file_handle *)pfStackY_15f0,&pfStackY_15e8,"db",&fStackY_15a0);
    uVar11 = 0;
    do {
      pcStackY_15f8 = (code *)0x1131c9;
      sprintf((char *)apfStackY_1390,"key%04d",uVar11);
      pcStackY_15f8 = (code *)0x1131d8;
      sprintf(acStackY_1490,"body%04d",uVar11);
      pfVar10 = pfStackY_15d8;
      pcStackY_15f8 = (code *)0x1131e5;
      sVar3 = strlen((char *)apfStackY_1390);
      pcStackY_15f8 = (code *)0x1131f0;
      sVar5 = strlen(acStackY_1490);
      pcStackY_15f8 = (code *)0x113204;
      ptr_handle = apfStackY_1390;
      pfVar15 = pfVar10;
      fVar1 = fdb_set_kv(pfVar10,apfStackY_1390,sVar3,acStackY_1490,sVar5);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_15f8 = (code *)0x1132c9;
        compact_with_snapshot_open_test();
        goto LAB_001132c9;
      }
      uVar6 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar6;
    } while (uVar6 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_15f8 = (code *)0x113224;
    pfVar15 = pfStackY_15f0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_15f0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_15c0 = pfStackY_15e8;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_15f8 = (code *)0x113241;
      pfVar15 = pfStackY_15f0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_15f0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
      ptr_handle = &pfStackY_15e0;
      pcStackY_15f8 = (code *)0x11325d;
      pfVar15 = pfStackY_15e8;
      fVar1 = fdb_snapshot_open(pfStackY_15e8,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
      pcStackY_15f8 = (code *)0x11326b;
      fdb_kvs_close(pfStackY_15e0);
      pcStackY_15f8 = (code *)0x113274;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_15f0);
      pfVar15 = pfStackY_15f0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
      pcStackY_15f8 = (code *)0x11327d;
      fVar1 = fdb_shutdown();
      pfVar15 = pfStackY_15f0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar19 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pcStackY_15f8 = (code *)0x1132b2;
        iVar2 = fprintf(_stderr,pcVar19,"compact with snapshot_open test");
        return iVar2;
      }
    }
    else {
LAB_001132c9:
      pcStackY_15f8 = (code *)0x1132ce;
      compact_with_snapshot_open_test();
LAB_001132ce:
      pcStackY_15f8 = (code *)0x1132d3;
      compact_with_snapshot_open_test();
LAB_001132d3:
      pcStackY_15f8 = (code *)0x1132d8;
      compact_with_snapshot_open_test();
LAB_001132d8:
      pcStackY_15f8 = (code *)0x1132dd;
      compact_with_snapshot_open_test();
    }
    pcStackY_15f8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_1640 = (code *)0x1132fe;
    sStackY_1608 = sVar3;
    ppfStackY_1600 = apfStackY_1390;
    pcStackY_15f8 = (code *)uVar11;
    gettimeofday(&tStackY_1618,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX_00 == 0) {
        pcStackY_1640 = (code *)0x11330d;
        compaction_cb_get();
        goto LAB_0011330d;
      }
    }
    else {
LAB_0011330d:
      if (extraout_RDX_00 != 0) goto LAB_00113374;
    }
    pcStackY_1640 = (code *)0x113324;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar15,&pfStackY_1630,&uStackY_1620);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_1640 = (code *)0x113348;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_15e8->kvs_config).custom_cmp_param,
                                &pfStackY_1628,pfStackY_1630->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011336a;
      pcStackY_1640 = (code *)0x113356;
      fVar1 = fdb_kvs_close(pfStackY_1628);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return 0;
      }
    }
    else {
      pcStackY_1640 = (code *)0x11336a;
      compaction_cb_get();
LAB_0011336a:
      pcStackY_1640 = (code *)0x11336f;
      compaction_cb_get();
    }
    pcStackY_1640 = (code *)0x113374;
    compaction_cb_get();
LAB_00113374:
    pcStackY_1640 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_1648 = "body%04d";
    pfStackY_1658 = pfVar10;
    pcStackY_19f8 = (code *)0x113396;
    pcStackY_1660 = acStackY_1490;
    pcStackY_1640 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1990,(__timezone_ptr_t)0x0);
    pcStackY_19f8 = (code *)0x11339b;
    memleak_start();
    pcStackY_19f8 = (code *)0x1133ab;
    fdb_get_default_config();
    pcStackY_19f8 = (code *)0x1133b8;
    fdb_get_default_kvs_config();
    fStackY_1968.compaction_cb_ctx = &uStackY_19b0;
    uStackY_19b0 = 0;
    uStackY_19a8 = 0;
    uStackY_19a0 = 0;
    fStackY_1968.wal_threshold = 0x400;
    fStackY_1968.flags = 1;
    fStackY_1968.compaction_cb = compaction_cb_markers;
    fStackY_1968.compaction_cb_mask = 0x1b;
    pcStackY_19f8 = (code *)0x1133fe;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_19f8 = (code *)0x113415;
    fdb_open(&pfStackY_19e8,"./compact_test1",&fStackY_1968);
    pcStackY_19f8 = (code *)0x11342c;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19b8,"db1",&fStackY_1980);
    pcStackY_19f8 = (code *)0x113443;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19c0,"db2",&fStackY_1980);
    pcStackY_19f8 = (code *)0x11345a;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19c8,"db3",&fStackY_1980);
    pcStackY_19f8 = (code *)0x113471;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19d0,"db4",&fStackY_1980);
    pcStackY_19f8 = (code *)0x113488;
    fdb_kvs_open(pfStackY_19e8,&pfStackY_19d8,"db5",&fStackY_1980);
    uVar11 = 0;
    do {
      iVar2 = (int)uVar11;
      if (iVar2 == 5) goto LAB_0011360c;
      uVar11 = 0;
      iStackY_19dc = iVar2;
      do {
        pcStackY_19f8 = (code *)0x1134c6;
        sprintf(acStackY_1770,"key%04d",uVar11);
        pcStackY_19f8 = (code *)0x1134d5;
        sprintf(acStackY_1870,"body%04d",uVar11);
        pfVar10 = pfStackY_19b8;
        pcStackY_19f8 = (code *)0x1134e2;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x1134f0;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113504;
        fdb_set_kv(pfVar10,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar10 = pfStackY_19c0;
        pcStackY_19f8 = (code *)0x113511;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x11351c;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113530;
        fdb_set_kv(pfVar10,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar10 = pfStackY_19c8;
        pcStackY_19f8 = (code *)0x11353d;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x113548;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x11355c;
        fdb_set_kv(pfVar10,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar10 = pfStackY_19d0;
        pcStackY_19f8 = (code *)0x113569;
        sVar3 = strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x113574;
        sVar5 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x113588;
        fdb_set_kv(pfVar10,acStackY_1770,sVar3,acStackY_1870,sVar5);
        pfVar15 = pfStackY_19d8;
        pcStackY_19f8 = (code *)0x113595;
        pfVar10 = (fdb_kvs_handle *)strlen(acStackY_1770);
        pcStackY_19f8 = (code *)0x1135a0;
        sVar3 = strlen(acStackY_1870);
        pcStackY_19f8 = (code *)0x1135be;
        fdb_set_kv(pfVar15,acStackY_1770,(size_t)pfVar10,acStackY_1870,sVar3);
        uVar6 = (int)uVar11 + 1;
        uVar11 = (ulong)uVar6;
      } while (uVar6 != 1000);
      pcStackY_19f8 = (code *)0x1135db;
      pfVar13 = pfStackY_19e8;
      fVar1 = fdb_commit(pfStackY_19e8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_19f8 = (code *)0x11366b;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_0011366b;
      }
      uVar11 = (ulong)(iStackY_19dc + 1U);
      uStackY_19b0 = CONCAT44(uStackY_19b0._4_4_,(iStackY_19dc + 1U) * 1000);
      pcStackY_19f8 = (code *)0x1135ff;
      fVar1 = fdb_compact(pfStackY_19e8,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_19f8 = (code *)0x11360c;
    compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
    pcStackY_19f8 = (code *)0x113616;
    pfVar13 = pfStackY_19e8;
    fVar1 = fdb_close(pfStackY_19e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_19f8 = (code *)0x11361f;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar19 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        pcStackY_19f8 = (code *)0x113654;
        iVar2 = fprintf(_stderr,pcVar19,"compact with snapshot_open multi kvs test");
        return iVar2;
      }
    }
    else {
LAB_0011366b:
      pcStackY_19f8 = (code *)0x113670;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_19f8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_1a00 = "body%04d";
    pcStackY_1a20 = "key%04d";
    pcStackY_1a70 = (code *)0x11369a;
    pcStackY_1a18 = acStackY_1870;
    pfStackY_1a10 = pfVar10;
    pcStackY_1a08 = acStackY_1770;
    pcStackY_19f8 = (code *)uVar11;
    gettimeofday(&tStackY_1a30,(__timezone_ptr_t)0x0);
    pcStackY_1a70 = (code *)0x1136a4;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_19e8->root;
    pcStackY_1a70 = (code *)0x1136b7;
    fVar1 = fdb_get_all_snap_markers(pfVar13,&pfStackY_1a68,&uStackY_1a60);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (pfStackY_1a68->num_kvs_markers != 6) {
        pcStackY_1a70 = (code *)0x113799;
        compaction_cb_markers();
      }
      seqnum = pfStackY_1a68->kvs_markers->seqnum;
      if (seqnum == (long)iVar2) {
        if (uStackY_1a60 != 0) {
          uVar11 = 0;
          do {
            if (pfStackY_1a68[uVar11].num_kvs_markers != 0) {
              lVar16 = 0;
              uVar17 = 0;
              do {
                pcVar19 = *(char **)((long)&(pfStackY_1a68[uVar11].kvs_markers)->kv_store_name +
                                    lVar16);
                if (pcVar19 != (char *)0x0) {
                  pcStackY_1a70 = (code *)0x11372e;
                  fdb_kvs_open(pfVar13,&pfStackY_1a58,pcVar19,&fStackY_1a48);
                  pcStackY_1a70 = (code *)0x113740;
                  fVar1 = fdb_snapshot_open(pfStackY_1a58,&pfStackY_1a50,seqnum);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1a70 = (code *)0x11374e;
                    fVar1 = fdb_kvs_close(pfStackY_1a50);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1a70 = (code *)0x1137a3;
                      compaction_cb_markers();
                      goto LAB_001137a3;
                    }
                    pcStackY_1a70 = (code *)0x11375c;
                    fVar1 = fdb_kvs_close(pfStackY_1a58);
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                  }
                  else {
LAB_001137a3:
                    pcStackY_1a70 = (code *)0x1137a8;
                    compaction_cb_markers();
                  }
                  pcStackY_1a70 = (code *)0x1137ad;
                  compaction_cb_markers();
                  goto LAB_001137ad;
                }
LAB_00113760:
                uVar17 = uVar17 + 1;
                lVar16 = lVar16 + 0x10;
              } while (uVar17 < (ulong)pfStackY_1a68[uVar11].num_kvs_markers);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 < uStackY_1a60);
        }
        return 0;
      }
    }
    else {
LAB_001137ad:
      pcStackY_1a70 = (code *)0x1137b2;
      compaction_cb_markers();
    }
    pcStackY_1a70 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1b78,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1b68.compaction_cb = cb_cancel_test;
    fStackY_1b68.compaction_cb_ctx = (void *)0x0;
    fStackY_1b68.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1b80,"compact_test",&fStackY_1b68);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1b80,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1b80);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pfStackY_1260 = (fdb_kvs_handle *)0x112abc;
  fVar1 = fdb_kvs_open(pfStack_1230,&pfStack_1228,"db",&fStack_11f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ac;
  pcVar7 = (char *)CONCAT71((int7)((ulong)pcVar7 >> 8),uStack_123c == 0);
  pcStack_1220 = pcVar19 + 0x1a;
  pfVar10 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  unaff_R13 = (fdb_kvs_handle *)auStack_10c8;
  pfVar18 = (fdb_kvs_handle *)0x0;
  do {
    uVar9 = (uint)pfVar18;
    uVar6 = uVar9 + (int)((ulong)pfVar18 / 5) * -5;
    pfStackY_1260 = (fdb_kvs_handle *)0x112b17;
    sprintf((char *)pfVar10,"key%06d",(ulong)uVar6);
    builtin_strncpy(pcVar19,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_1220,"<end>",6);
    pcVar21 = "updated_value%08d";
    if (uVar9 < 5) {
      pcVar21 = "value%08d";
    }
    pfStackY_1260 = (fdb_kvs_handle *)0x112b5a;
    sprintf(pcVar19,pcVar21,(ulong)uVar6);
    pfVar15 = pfStack_1228;
    pfStackY_1260 = (fdb_kvs_handle *)0x112b67;
    sVar3 = strlen((char *)pfVar10);
    pfStackY_1260 = (fdb_kvs_handle *)0x112b7f;
    fVar1 = fdb_set_kv(pfVar15,pfVar10,sVar3 + 1,pcVar19,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar8 = pfVar18;
    if (uStack_123c == 3) {
LAB_00112ba0:
      pcVar7 = (char *)((ulong)pfVar8 & 0xffffffffffffff01);
    }
    else if (uStack_123c == 2) {
      pfVar8 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)pfVar18 >> 8),~(byte)pfVar18);
      goto LAB_00112ba0;
    }
    pfStackY_1260 = (fdb_kvs_handle *)0x112bb2;
    fVar1 = fdb_commit(pfStack_1230,(fdb_commit_opt_t)pcVar7);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113064;
    pfStackY_1260 = (fdb_kvs_handle *)0x112bc7;
    fVar1 = fdb_get_kvs_info(pfStack_1228,(fdb_kvs_info *)unaff_R13);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    pfVar18 = (fdb_kvs_handle *)(ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 10);
  pfStackY_1260 = (fdb_kvs_handle *)0x112bf0;
  fVar1 = fdb_get_all_snap_markers(pfStack_1230,&pfStack_1210,(uint64_t *)&iStack_1218);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b1;
  pfVar15 = (fdb_kvs_handle *)(CONCAT44(uStack_1214,iStack_1218) >> 1);
  iVar2 = (int)pfVar15;
  pfStackY_1260 = (fdb_kvs_handle *)0x112c21;
  fVar1 = fdb_compact_upto(pfStack_1230,"./compact_test2",pfStack_1210[iVar2].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b6;
  if (-1 < (int)(iStack_1218 - 1U)) {
    pfVar15 = (fdb_kvs_handle *)(ulong)(iStack_1218 - 1U);
    lStack_11f8 = (long)iVar2;
    pfVar10 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
    do {
      pfVar18 = (fdb_kvs_handle *)(pfStack_1210[(long)pfVar15].kvs_markers)->seqnum;
      pfStackY_1260 = (fdb_kvs_handle *)0x112c6e;
      fVar1 = fdb_snapshot_open(pfStack_1228,&pfStack_1208,(fdb_seqnum_t)pfVar18);
      if (lStack_11f8 < (long)pfVar15) {
        pfVar8 = pfVar15;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113089;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011308e;
        pfStackY_1260 = (fdb_kvs_handle *)0x112caf;
        pfStack_1200 = pfVar15;
        fVar1 = fdb_iterator_init(pfStack_1208,&pfStack_1248,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113093;
        pfVar18 = (fdb_kvs_handle *)((long)&pfVar18[-1].bub_ctx.handle + 3);
        pfVar15 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_1238 = (fdb_kvs_handle *)0x0;
          pfStackY_1260 = (fdb_kvs_handle *)0x112cd5;
          fVar1 = fdb_iterator_get(pfStack_1248,(fdb_doc **)&pfStack_1238);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfStackY_1260 = (fdb_kvs_handle *)0x112cf0;
          sprintf((char *)pfVar10,"key%06d",(ulong)pfVar15 & 0xffffffff);
          builtin_strncpy(pcVar19,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
          builtin_strncpy(pcStack_1220,"<end>",6);
          pcVar7 = "value%08d";
          if (pfVar15 < pfVar18) {
            pcVar7 = "updated_value%08d";
          }
          pfStackY_1260 = (fdb_kvs_handle *)0x112d32;
          sprintf(pcVar19,pcVar7,(ulong)pfVar15 & 0xffffffff);
          pcVar7 = (char *)pfStack_1238;
          unaff_R13 = (fdb_kvs_handle *)pfStack_1238->op_stats;
          pfStackY_1260 = (fdb_kvs_handle *)0x112d4a;
          iVar2 = bcmp(unaff_R13,pfVar10,*(size_t *)&pfStack_1238->kvs_config);
          if (iVar2 != 0) {
            pfStackY_1260 = (fdb_kvs_handle *)0x113054;
            compact_upto_overwrite_test();
LAB_00113054:
            pfStackY_1260 = (fdb_kvs_handle *)0x11305f;
            compact_upto_overwrite_test();
            goto LAB_0011305f;
          }
          unaff_R13 = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar7)->field_6).seqtree;
          pfStackY_1260 = (fdb_kvs_handle *)0x112d65;
          iVar2 = bcmp(unaff_R13,pcVar19,
                       (size_t)(((fdb_kvs_handle *)pcVar7)->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113054;
          pfVar15 = (fdb_kvs_handle *)&(pfVar15->kvs_config).field_0x1;
          pfStackY_1260 = (fdb_kvs_handle *)0x112d78;
          fdb_doc_free((fdb_doc *)pcVar7);
          pfStackY_1260 = (fdb_kvs_handle *)0x112d82;
          fVar1 = fdb_iterator_next(pfStack_1248);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pfStackY_1260 = (fdb_kvs_handle *)0x112d94;
        fVar1 = fdb_iterator_close(pfStack_1248);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113098;
        if ((int)pfVar15 != 5) goto LAB_001130a2;
        pfStackY_1260 = (fdb_kvs_handle *)0x112daf;
        fVar1 = fdb_kvs_close(pfStack_1208);
        pfVar15 = pfStack_1200;
        pfVar8 = pfStack_1200;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011309d;
      }
      pfVar15 = (fdb_kvs_handle *)((long)&pfVar8[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar8);
  }
  pfVar10 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  pfStackY_1260 = (fdb_kvs_handle *)0x112dec;
  fVar1 = fdb_iterator_init(pfStack_1228,&pfStack_1248,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130bb;
  unaff_R13 = (fdb_kvs_handle *)(auStack_10c8 + 0x30);
  pcVar7 = "updated_value%08d";
  pfVar15 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1238 = (fdb_kvs_handle *)0x0;
    pfStackY_1260 = (fdb_kvs_handle *)0x112e1d;
    fVar1 = fdb_iterator_get(pfStack_1248,(fdb_doc **)&pfStack_1238);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStackY_1260 = (fdb_kvs_handle *)0x112e38;
    sprintf((char *)unaff_R13,"key%06d",pfVar15);
    builtin_strncpy(pcVar19,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_1220,"<end>",6);
    pfStackY_1260 = (fdb_kvs_handle *)0x112e68;
    sprintf(pcVar19,"updated_value%08d",pfVar15);
    pfVar18 = pfStack_1238;
    pfVar10 = (fdb_kvs_handle *)pfStack_1238->op_stats;
    pfStackY_1260 = (fdb_kvs_handle *)0x112e7f;
    iVar2 = bcmp(pfVar10,unaff_R13,*(size_t *)&pfStack_1238->kvs_config);
    if (iVar2 != 0) goto LAB_0011306e;
    pfVar10 = (fdb_kvs_handle *)(pfVar18->field_6).seqtree;
    pfStackY_1260 = (fdb_kvs_handle *)0x112e9a;
    iVar2 = bcmp(pfVar10,pcVar19,(size_t)(pfVar18->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_0011307e;
    pfVar15 = (fdb_kvs_handle *)(ulong)((int)pfVar15 + 1);
    pfStackY_1260 = (fdb_kvs_handle *)0x112eac;
    fdb_doc_free((fdb_doc *)pfVar18);
    pfStackY_1260 = (fdb_kvs_handle *)0x112eb6;
    fVar1 = fdb_iterator_next(pfStack_1248);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStackY_1260 = (fdb_kvs_handle *)0x112ec8;
  fVar1 = fdb_iterator_close(pfStack_1248);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130c0;
  if ((int)pfVar15 != 5) goto LAB_001130c5;
  pfStackY_1260 = (fdb_kvs_handle *)0x112ee8;
  fVar1 = fdb_free_snap_markers(pfStack_1210,CONCAT44(uStack_1214,iStack_1218));
  uVar6 = uStack_123c;
  pfVar15 = (fdb_kvs_handle *)(ulong)uStack_123c;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ca;
  pfStackY_1260 = (fdb_kvs_handle *)0x112efc;
  free(pcVar19);
  pfStackY_1260 = (fdb_kvs_handle *)0x112f06;
  fVar1 = fdb_close(pfStack_1230);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130cf;
  pfStackY_1260 = (fdb_kvs_handle *)0x112f13;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130d4;
  pfStackY_1260 = (fdb_kvs_handle *)0x112f20;
  memleak_end();
  builtin_strncpy(acStack_11d8 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_11d8,"compact upto ove",0x10);
  switch(uVar6) {
  case 0:
    pfStackY_1260 = (fdb_kvs_handle *)0x112f66;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pfStackY_1260 = (fdb_kvs_handle *)0x112fea;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3," (WAL)",7);
    break;
  case 2:
    pfStackY_1260 = (fdb_kvs_handle *)0x112f92;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3 + 0xe,"ie/WAL)",8);
    uVar22._0_1_ = ' ';
    uVar22._1_1_ = 'H';
    uVar22._2_1_ = 'B';
    uVar22._3_1_ = '+';
    uVar23._0_1_ = 't';
    uVar23._1_1_ = 'r';
    uVar23._2_1_ = 'i';
    uVar23._3_1_ = 'e';
    goto LAB_00112fd3;
  case 3:
    pfStackY_1260 = (fdb_kvs_handle *)0x112fba;
    sVar3 = strlen(acStack_11d8);
    builtin_strncpy(acStack_11d8 + sVar3 + 0xe,"B+trie)",8);
    uVar22._0_1_ = ' ';
    uVar22._1_1_ = 'W';
    uVar22._2_1_ = 'A';
    uVar22._3_1_ = 'L';
    uVar23._0_1_ = '/';
    uVar23._1_1_ = 'H';
    uVar23._2_1_ = 'B';
    uVar23._3_1_ = '+';
LAB_00112fd3:
    pcVar19 = acStack_11d8 + sVar3;
    pcVar19[0] = ' ';
    pcVar19[1] = '(';
    pcVar19[2] = 'm';
    pcVar19[3] = 'i';
    pcVar19 = acStack_11d8 + sVar3 + 4;
    pcVar19[0] = 'x';
    pcVar19[1] = 'e';
    pcVar19[2] = 'd';
    pcVar19[3] = ',';
    *(undefined4 *)(acStack_11d8 + sVar3 + 8) = uVar22;
    *(undefined4 *)(acStack_11d8 + sVar3 + 0xc) = uVar23;
  }
  pcVar19 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar19 = "%s FAILED\n";
  }
  pfStackY_1260 = (fdb_kvs_handle *)0x113032;
  iVar2 = fprintf(_stderr,pcVar19,acStack_11d8);
  return iVar2;
}

Assistant:

static fdb_compact_decision cb_upt(fdb_file_handle *fhandle,
                                   fdb_compaction_status status,
                                   const char *kv_name,
                                   fdb_doc *doc, uint64_t old_offset,
                                   uint64_t new_offset,
                                   void *ctx)
{
    TEST_INIT();
    struct cb_upt_args *args = (struct cb_upt_args *)ctx;
    (void) fhandle;
    (void) doc;
    (void) old_offset;
    (void) new_offset;

    if (status == FDB_CS_MOVE_DOC) {
        int i, j;
        int n = 10;
        char keybuf[256], bodybuf[256];
        char keystr[] = "new%04d";
        char valuestr[] = "new_body%04d";
        fdb_status s;
        args->nmoves++;
        if (args->nmoves > n/2 && !args->done) {
            // verify if the key is stripped off its prefix
            fdb_doc tdoc;
            memset(&tdoc, 0, sizeof(fdb_doc));
            tdoc.key = doc->key;
            tdoc.keylen = doc->keylen;
            s = fdb_get(args->handle, &tdoc);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            free(tdoc.meta);
            free(tdoc.body);
            // insert new docs
            for (i=0;i<n/2;++i){
                sprintf(keybuf, keystr, i);
                sprintf(bodybuf, valuestr, i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);

                for (j=0; j<=i; ++j){
                    void *v_out;
                    size_t vlen_out;
                    sprintf(keybuf, keystr, i);
                    sprintf(bodybuf, valuestr, i);
                    s = fdb_get_kv(args->handle2, keybuf, strlen(keybuf)+1,
                        &v_out, &vlen_out);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    fdb_free_block(v_out);
                }
            }
            args->done = 1;
        }
        if (args->nmoves > n && args->done == 1) {
            // the first phase is done. insert new docs.
            for (i=0;i<2;++i){
                sprintf(keybuf, "xxx%d", i);
                sprintf(bodybuf, "xxxvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_commit(args->file, FDB_COMMIT_NORMAL);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 2;
        }
        if (args->nmoves == (n*3/2 + 2) && args->done == 2) {
            // during the second-second phase,
            // insert new docs, and do not commit.
            for (i=0;i<2;++i){
                sprintf(keybuf, "zzz%d", i);
                sprintf(bodybuf, "zzzvalue%d", i);
                s = fdb_set_kv(args->handle, keybuf, strlen(keybuf)+1,
                                             bodybuf, strlen(bodybuf)+1);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            args->done = 3;
        }
        TEST_CMP(kv_name, "db", 2);
    }

    return 0;
}